

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.hpp
# Opt level: O3

void __thiscall Runner::run(Runner *this)

{
  pointer pcVar1;
  undefined4 uVar2;
  Schedule *__tmp;
  Optimizer optimizer;
  ScheduleHandle local_58;
  Optimizer local_48;
  undefined1 local_40 [32];
  
  Schedule::fromFile((pair<std::shared_ptr<Schedule>,_int> *)local_40,&this->input);
  uVar2 = local_40._16_4_;
  local_58.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_40._0_8_;
  local_58.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_;
  pcVar1 = (this->input)._M_dataplus._M_p;
  local_48.limit = this->limit;
  Optimizer::name_abi_cxx11_((string *)local_40,&local_48);
  printf("Running case %s (%d operators) with %s ... \n",pcVar1,(ulong)(uint)uVar2,local_40._0_8_);
  if ((element_type *)local_40._0_8_ != (element_type *)(local_40 + 0x10)) {
    operator_delete((void *)local_40._0_8_,CONCAT44(local_40._20_4_,local_40._16_4_) + 1);
  }
  Optimizer::optimize(&local_48,&local_58,&this->output);
  if (local_58.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return;
}

Assistant:

void run() {
        ScheduleHandle schedule;
        int count;
        std::tie(schedule, count) = Schedule::fromFile(input);
        auto optimizer = Optimizer(limit);
        printf("Running case %s (%d operators) with %s ... \n", input.c_str(), count, optimizer.name().c_str());
        optimizer.optimize(schedule, output);
    }